

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

bool __thiscall vkt::memory::anon_unknown_0::MemoryTestInstance::prepare(MemoryTestInstance *this)

{
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  *this_00;
  TestLog *log;
  Memory *pMVar1;
  pointer ppCVar2;
  Command *pCVar3;
  PrepareContext *pPVar4;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  de::toString<unsigned_int>(&local_a0,&this->m_memoryTypeNdx);
  std::operator+(&local_100,"MemoryType",&local_a0);
  std::operator+(&local_e0,&local_100,"Prepare");
  de::toString<unsigned_long>(&local_120,&this->m_iteration);
  std::operator+(&local_160,&local_e0,&local_120);
  de::toString<unsigned_int>(&local_40,&this->m_memoryTypeNdx);
  std::operator+(&local_80,"Memory type ",&local_40);
  std::operator+(&local_c0,&local_80," prepare iteration");
  de::toString<unsigned_long>(&local_60,&this->m_iteration);
  std::operator+(&local_140,&local_c0,&local_60);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,&local_160,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  pPVar4 = (PrepareContext *)operator_new(0x70);
  pMVar1 = (this->m_memory).
           super_UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
           .m_data.ptr;
  pPVar4->m_context =
       (this->m_renderContext).
       super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
       .m_data.ptr;
  pPVar4->m_memory = pMVar1;
  (pPVar4->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       0;
  (pPVar4->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (pPVar4->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pPVar4->m_currentBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (pPVar4->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       0;
  (pPVar4->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_160._M_dataplus._M_p = (pointer)0x0;
  (pPVar4->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pPVar4->m_currentImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_prepareContext;
  if ((this->m_prepareContext).
      super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
      .m_data.ptr != pPVar4) {
    de::details::
    UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
    ::reset(&this_00->
             super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
           );
    (this_00->
    super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
    ).m_data.ptr = pPVar4;
  }
  de::details::
  UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::reset((UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
           *)&local_160);
  local_c0._M_dataplus._M_p = (pointer)0x0;
  while( true ) {
    ppCVar2 = (this->m_commands).
              super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)((long)(this->m_commands).
                        super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3) <=
        local_c0._M_dataplus._M_p) break;
    pCVar3 = ppCVar2[(long)local_c0._M_dataplus._M_p];
    (*pCVar3->_vptr_Command[5])
              (pCVar3,(this_00->
                      super_UniqueBase<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
                      ).m_data.ptr);
    local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p + 1;
  }
  this->m_stage = (StageFunc)execute;
  *(undefined8 *)&this->field_0x258 = 0;
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return true;
}

Assistant:

bool MemoryTestInstance::prepare (void)
{
	TestLog&					log		= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section	(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Prepare" + de::toString(m_iteration),
											  "Memory type " + de::toString(m_memoryTypeNdx) + " prepare iteration" + de::toString(m_iteration));

	m_prepareContext = MovePtr<PrepareContext>(new PrepareContext(*m_renderContext, *m_memory));

	DE_ASSERT(!m_commands.empty());

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.prepare(*m_prepareContext);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to prepare, got exception: " + string(e.getMessage()));
			return nextMemoryType();
		}
	}

	m_stage = &MemoryTestInstance::execute;
	return true;
}